

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  Printer *this;
  long *in_RDX;
  byte in_SIL;
  int lastindex;
  string fullname;
  Printer printer;
  FileDescriptor *in_stack_00000128;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  string filename;
  Printer *in_stack_fffffffffffffe88;
  Printer *this_00;
  ZeroCopyOutputStream *output_00;
  string local_158 [32];
  string *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  Printer *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  Printer *in_stack_fffffffffffffef0;
  undefined1 local_40 [8];
  ZeroCopyOutputStream local_38 [4];
  long *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  output_00 = local_38;
  local_18 = in_RDX;
  GeneratedMetadataFileName_abi_cxx11_(in_stack_00000128,printer.annotation_collector_._7_1_);
  this = (Printer *)(**(code **)(*local_18 + 0x10))(local_18,output_00);
  this_00 = (Printer *)local_40;
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
  ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
            ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              *)this_00,(pointer)in_stack_fffffffffffffe88);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         *)this_00);
  io::Printer::Printer(this,output_00,(char)((ulong)this_00 >> 0x38));
  GenerateHead((FileDescriptor *)this_00,in_stack_fffffffffffffe88);
  FilenameToClassname(in_stack_fffffffffffffec8);
  iVar1 = std::__cxx11::string::find_last_of(&stack0xfffffffffffffef0,0x7627d6);
  if (iVar1 == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffef0,(char *)CONCAT44(0xffffffff,in_stack_fffffffffffffee8),
               &in_stack_fffffffffffffee0->variable_delimiter_,in_stack_fffffffffffffed8);
  }
  else {
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffec8,(ulong)&stack0xfffffffffffffef0);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffef0,(char *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
               &in_stack_fffffffffffffee0->variable_delimiter_,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
    std::__cxx11::string::substr((ulong)local_158,(ulong)&stack0xfffffffffffffef0);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffffef0,(char *)CONCAT44(iVar1,in_stack_fffffffffffffee8),
               &in_stack_fffffffffffffee0->variable_delimiter_,in_stack_fffffffffffffed8);
    std::__cxx11::string::~string(local_158);
  }
  Indent((Printer *)0x4a8d66);
  GenerateAddFileToPool
            ((FileDescriptor *)printer._72_8_,(bool)printer.indent_.field_2._M_local_buf[0xf],
             (Printer *)printer.indent_.field_2._M_allocated_capacity);
  Outdent((Printer *)0x4a8d97);
  io::Printer::Print<>(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  io::Printer::~Printer(this_00);
  std::
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 *)this);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}